

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O1

void __thiscall Centaurus::NFA<char>::parse_unit(NFA<char> *this,Stream *stream,wchar_t ch)

{
  wchar_t *pwVar1;
  pointer pNVar2;
  wchar_t wVar3;
  StreamException *__return_storage_ptr__;
  CharClass<char> local_40;
  
  if (ch < L'[') {
    if (ch == L'(') {
      NFA((NFA<char> *)&local_40,stream);
      concat(this,(NFA<char> *)&local_40);
      local_40._vptr_CharClass = (_func_int **)&PTR__NFABase_001a01f8;
      std::
      vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
      ::~vector((vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                 *)&local_40.m_ranges);
      goto LAB_00155b42;
    }
    if (ch == L'.') {
      CharClass<char>::CharClass(&local_40,L'\0',L'ÿ');
      add_state(this,&local_40);
    }
    else {
LAB_00155ac4:
      CharClass<char>::CharClass(&local_40,ch);
      add_state(this,&local_40);
    }
  }
  else if (ch == L'[') {
    CharClass<char>::CharClass(&local_40,stream);
    add_state(this,&local_40);
  }
  else {
    if (ch != L'\\') goto LAB_00155ac4;
    wVar3 = Stream::get(stream);
    if (((0x35 < (uint)(wVar3 + L'\xffffffd8')) ||
        ((0x3800000080004fU >> ((ulong)(uint)(wVar3 + L'\xffffffd8') & 0x3f) & 1) == 0)) &&
       (2 < (uint)(wVar3 + L'\xffffff85'))) {
      __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
      Stream::unexpected(__return_storage_ptr__,stream,wVar3);
      __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                  StreamException::~StreamException);
    }
    CharClass<char>::CharClass(&local_40,wVar3);
    add_state(this,&local_40);
  }
  local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            (&local_40.m_ranges);
LAB_00155b42:
  pwVar1 = (stream->m_cur)._M_current;
  if (pwVar1 == (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
    wVar3 = L'\0';
  }
  else {
    wVar3 = *pwVar1;
  }
  if (wVar3 == L'*') {
    Stream::get(stream);
    pwVar1 = (stream->m_cur)._M_current;
    if (pwVar1 == (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
      wVar3 = L'\0';
    }
    else {
      wVar3 = *pwVar1;
    }
    if (wVar3 == L'*') {
      Stream::get(stream);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      NFABaseState<char,_int>::add_transition
                ((this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                 super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,&local_40,1,false);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
                (&local_40.m_ranges);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      add_state(this,&local_40);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
                (&local_40.m_ranges);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar2 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
               super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      NFABaseState<char,_int>::add_transition
                (pNVar2 + 1,&local_40,
                 (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).
                                     m_states.
                                     super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) >> 3
                      ) * -0x33333333 + -1,false);
    }
    else if (wVar3 == L'?') {
      Stream::get(stream);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      NFABaseState<char,_int>::add_transition
                ((this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                 super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,&local_40,1,false);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
                (&local_40.m_ranges);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      add_state(this,&local_40);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
                (&local_40.m_ranges);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar2 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
               super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      NFABaseState<char,_int>::add_transition
                (pNVar2 + 1,&local_40,
                 (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).
                                     m_states.
                                     super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) >> 3
                      ) * -0x33333333 + -1,false);
    }
    else if (wVar3 == L'+') {
      Stream::get(stream);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      NFABaseState<char,_int>::add_transition
                ((this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                 super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,&local_40,1,true);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
                (&local_40.m_ranges);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      add_state(this,&local_40);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
                (&local_40.m_ranges);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar2 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
               super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      NFABaseState<char,_int>::add_transition
                (pNVar2 + 1,&local_40,
                 (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).
                                     m_states.
                                     super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) >> 3
                      ) * -0x33333333 + -1,false);
    }
    else {
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      NFABaseState<char,_int>::add_transition
                ((this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                 super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,&local_40,1,false);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
                (&local_40.m_ranges);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      add_state(this,&local_40);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
                (&local_40.m_ranges);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar2 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
               super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      NFABaseState<char,_int>::add_transition
                (pNVar2 + 1,&local_40,
                 (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).
                                     m_states.
                                     super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) >> 3
                      ) * -0x33333333 + -1,false);
    }
  }
  else if (wVar3 == L'?') {
    Stream::get(stream);
    pwVar1 = (stream->m_cur)._M_current;
    if (pwVar1 == (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
      wVar3 = L'\0';
    }
    else {
      wVar3 = *pwVar1;
    }
    if (wVar3 == L'*') {
      Stream::get(stream);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar2 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
               super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      NFABaseState<char,_int>::add_transition
                (pNVar2 + 1,&local_40,
                 (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).
                                     m_states.
                                     super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) >> 3
                      ) * -0x33333333 + -1,false);
    }
    else if (wVar3 == L'?') {
      Stream::get(stream);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar2 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
               super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      NFABaseState<char,_int>::add_transition
                (pNVar2 + 1,&local_40,
                 (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).
                                     m_states.
                                     super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) >> 3
                      ) * -0x33333333 + -1,false);
    }
    else {
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pNVar2 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
               super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      NFABaseState<char,_int>::add_transition
                (pNVar2 + 1,&local_40,
                 (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).
                                     m_states.
                                     super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar2) >> 3
                      ) * -0x33333333 + -1,false);
    }
  }
  else {
    if (wVar3 != L'+') {
      return;
    }
    Stream::get(stream);
    pwVar1 = (stream->m_cur)._M_current;
    if (pwVar1 == (stream->m_str)._M_dataplus._M_p + (stream->m_str)._M_string_length) {
      wVar3 = L'\0';
    }
    else {
      wVar3 = *pwVar1;
    }
    if (wVar3 == L'*') {
      Stream::get(stream);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      NFABaseState<char,_int>::add_transition
                ((this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                 super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,&local_40,1,false);
    }
    else if (wVar3 == L'?') {
      Stream::get(stream);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      NFABaseState<char,_int>::add_transition
                ((this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                 super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,&local_40,1,false);
    }
    else if (wVar3 == L'+') {
      Stream::get(stream);
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      NFABaseState<char,_int>::add_transition
                ((this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                 super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,&local_40,1,true);
    }
    else {
      local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_40.m_ranges.
      super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      NFABaseState<char,_int>::add_transition
                ((this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                 super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,&local_40,1,false);
    }
  }
  local_40._vptr_CharClass = (_func_int **)&PTR__CharClass_001a0030;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector
            (&local_40.m_ranges);
  return;
}

Assistant:

void parse_unit(Stream& stream, wchar_t ch)
    {
        switch (ch)
        {
        case L'\\':
            ch = stream.get();
            switch (ch)
            {
            case L'[':
            case L']':
            case L'+':
            case L'*':
            case L'{':
            case L'}':
            case L'?':
            case L'\\':
            case L'|':
            case L'(':
            case L')':
            case L'.':
                add_state(CharClass<TCHAR>(ch));
                break;
            default:
                throw stream.unexpected(ch);
            }
            break;
        case L'[':
            add_state(CharClass<TCHAR>(stream));
            break;
        case L'.':
            add_state(CharClass<TCHAR>::make_star());
            break;
        case L'(':
            concat(NFA<TCHAR>(stream));
            break;
        default:
            add_state(CharClass<TCHAR>(ch));
            break;
        }
        ch = stream.peek();
        switch (ch)
        {
        case L'+':
            stream.discard();
            ch = stream.peek();
            switch (ch)
            {
            case L'+':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1, true);
                break;
            case L'?':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                break;
            case L'*':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                break;
            default:
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                break;
            }
            break;
        case L'*':
            stream.discard();
            ch = stream.peek();
            switch (ch)
            {
            case L'+':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1, true);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            case L'?':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            case L'*':
                stream.discard();
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            default:
                //Add an epsilon transition to the last state
                add_transition_to(CharClass<TCHAR>(), 1);
                //Add a confluence
                add_state(CharClass<TCHAR>());
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            }
            break;
        case L'?':
            stream.discard();
            ch = stream.peek();
            switch (ch)
            {
            case L'?':
                stream.discard();
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            case L'*':
                stream.discard();
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            default:
                //Add a skipping transition
                add_transition_from(CharClass<TCHAR>(), 1);
                break;
            }
            break;
        }
    }